

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O3

Bytes __thiscall Omega_h::filter_parents(Omega_h *this,Parents *c2p,Int parent_dim)

{
  size_type *psVar1;
  int *piVar2;
  void *pvVar3;
  uint uVar4;
  Alloc *pAVar5;
  void *pvVar6;
  undefined8 uVar7;
  long *plVar8;
  undefined8 *puVar9;
  Alloc **__dest;
  long lVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  ulong *puVar12;
  void *extraout_RDX;
  int iVar13;
  ulong uVar14;
  Alloc *pAVar15;
  ulong uVar16;
  size_t sVar17;
  Bytes BVar18;
  ScopedTimer omega_h_scoped_function_timer;
  ScopedTimer omega_h_scoped_function_timer_1;
  string __str;
  Write<signed_char> filter;
  type f;
  size_type __dnew;
  ScopedTimer local_15a;
  ScopedTimer local_159;
  string local_158;
  uint local_138;
  Alloc *local_130;
  void *local_128;
  uint local_11c;
  ulong *local_118;
  long local_110;
  ulong local_108;
  long lStack_100;
  Alloc **local_f8;
  Alloc *local_f0;
  Alloc *local_e8 [2];
  Write<signed_char> local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  void *local_b8;
  Alloc *local_b0;
  void *pvStack_a8;
  Int local_a0;
  Alloc *local_98;
  void *pvStack_90;
  Alloc *local_88;
  long local_80;
  undefined1 local_78 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  void *local_50;
  Alloc *local_48;
  Alloc *local_40;
  Alloc *local_38;
  
  local_118 = &local_108;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_118,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
             ,"");
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_118);
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 == paVar11) {
    local_b0 = (Alloc *)paVar11->_M_allocated_capacity;
    pvStack_a8 = (void *)plVar8[3];
    local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&local_b0;
  }
  else {
    local_b0 = (Alloc *)paVar11->_M_allocated_capacity;
    local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar8;
  }
  local_b8 = (void *)plVar8[1];
  *plVar8 = (long)paVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_f8,3,0x10a);
  pAVar15 = (Alloc *)0xf;
  if (local_c0 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)&local_b0) {
    pAVar15 = local_b0;
  }
  if (pAVar15 < (Alloc *)((long)local_f0 + (long)local_b8)) {
    pAVar15 = (Alloc *)0xf;
    if (local_f8 != local_e8) {
      pAVar15 = local_e8[0];
    }
    if (pAVar15 < (Alloc *)((long)local_f0 + (long)local_b8)) goto LAB_001cc746;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_c0);
  }
  else {
LAB_001cc746:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_f8);
  }
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  psVar1 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_158.field_2._M_allocated_capacity = *psVar1;
    local_158.field_2._8_8_ = puVar9[3];
  }
  else {
    local_158.field_2._M_allocated_capacity = *psVar1;
    local_158._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_158._M_string_length = puVar9[1];
  *puVar9 = psVar1;
  puVar9[1] = 0;
  *(undefined1 *)psVar1 = 0;
  begin_code("filter_parents",local_158._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8,(ulong)((long)&local_e8[0]->size + 1));
  }
  if (local_c0 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)&local_b0) {
    operator_delete(local_c0,(ulong)((long)&local_b0->size + 1));
  }
  if (local_118 != &local_108) {
    operator_delete(local_118,local_108 + 1);
  }
  pAVar15 = (c2p->parent_idx).write_.shared_alloc_.alloc;
  if (((ulong)pAVar15 & 1) == 0) {
    sVar17 = pAVar15->size;
  }
  else {
    sVar17 = (ulong)pAVar15 >> 3;
  }
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
  Write<signed_char>::Write(&local_d8,(LO)(sVar17 >> 2),&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  pvVar6 = local_d8.shared_alloc_.direct_ptr;
  pAVar15 = (c2p->parent_idx).write_.shared_alloc_.alloc;
  local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)pAVar15;
  if (((ulong)pAVar15 & 7) == 0 && pAVar15 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&pAVar15->size)->_M_allocated_capacity * 8 + 1);
    }
    else {
      pAVar15->use_count = pAVar15->use_count + 1;
    }
  }
  local_b8 = (c2p->parent_idx).write_.shared_alloc_.direct_ptr;
  local_b0 = (c2p->codes).write_.shared_alloc_.alloc;
  if (((ulong)local_b0 & 7) == 0 && local_b0 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b0 = (Alloc *)(local_b0->size * 8 + 1);
    }
    else {
      local_b0->use_count = local_b0->use_count + 1;
    }
  }
  pvVar3 = (c2p->codes).write_.shared_alloc_.direct_ptr;
  local_98 = local_d8.shared_alloc_.alloc;
  if (((ulong)local_d8.shared_alloc_.alloc & 7) == 0 && local_d8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_98 = (Alloc *)((local_d8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_d8.shared_alloc_.alloc)->use_count = (local_d8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pvStack_90 = local_d8.shared_alloc_.direct_ptr;
  if (((ulong)pAVar15 & 1) == 0) {
    uVar14 = ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&pAVar15->size)->_M_allocated_capacity;
  }
  else {
    uVar14 = (ulong)pAVar15 >> 3;
  }
  local_f8 = local_e8;
  local_88 = (Alloc *)0x5d;
  local_11c = parent_dim;
  pvStack_a8 = pvVar3;
  local_a0 = parent_dim;
  local_60._8_8_ = local_98;
  local_50 = local_b8;
  local_48 = (Alloc *)local_c0;
  local_40 = local_b0;
  local_38 = (Alloc *)this;
  __dest = (Alloc **)std::__cxx11::string::_M_create((ulong *)&local_f8,(ulong)&local_88);
  pAVar15 = local_88;
  local_e8[0] = local_88;
  local_f8 = __dest;
  memcpy(__dest,
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
         ,0x5d);
  local_f0 = pAVar15;
  *(undefined1 *)((long)__dest + (long)pAVar15) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_f8);
  uVar4 = local_11c;
  puVar12 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar12) {
    local_108 = *puVar12;
    lStack_100 = plVar8[3];
    local_118 = &local_108;
  }
  else {
    local_108 = *puVar12;
    local_118 = (ulong *)*plVar8;
  }
  local_110 = plVar8[1];
  *plVar8 = (long)puVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_88 = (Alloc *)local_78;
  std::__cxx11::string::_M_construct((ulong)&local_88,'\x02');
  *(undefined2 *)&local_88->size = 0x3438;
  uVar16 = 0xf;
  if (local_118 != &local_108) {
    uVar16 = local_108;
  }
  if (uVar16 < (ulong)(local_80 + local_110)) {
    uVar16 = 0xf;
    if (local_88 != (Alloc *)local_78) {
      uVar16 = local_78._0_8_;
    }
    if ((ulong)(local_80 + local_110) <= uVar16) {
      plVar8 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_88,0,(char *)0x0,(ulong)local_118);
      goto LAB_001ccb00;
    }
  }
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_88);
LAB_001ccb00:
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  pAVar15 = (Alloc *)(plVar8 + 2);
  if ((Alloc *)*plVar8 == pAVar15) {
    local_158.field_2._M_allocated_capacity = pAVar15->size;
    local_158.field_2._8_8_ = plVar8[3];
  }
  else {
    local_158.field_2._M_allocated_capacity = pAVar15->size;
    local_158._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_158._M_string_length = plVar8[1];
  *plVar8 = (long)pAVar15;
  plVar8[1] = 0;
  *(undefined1 *)&pAVar15->size = 0;
  begin_code("parallel_for",local_158._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,(ulong)(local_158.field_2._M_allocated_capacity + 1))
    ;
  }
  if (local_88 != (Alloc *)local_78) {
    operator_delete(local_88,local_78._0_8_ + 1);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118,local_108 + 1);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8,(ulong)((long)&local_e8[0]->size + 1));
  }
  iVar13 = (int)(uVar14 >> 2);
  if (0 < iVar13) {
    local_158._M_dataplus._M_p = (pointer)local_48;
    if (((ulong)local_48 & 7) == 0 && local_48 != (Alloc *)0x0) {
      local_158._M_dataplus._M_p =
           (pointer)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&local_48->size)->_M_allocated_capacity * 8 + 1);
    }
    local_158._M_string_length = (size_type)local_50;
    local_158.field_2._M_allocated_capacity = (size_type)local_40;
    if (((ulong)local_40 & 7) == 0 && local_40 != (Alloc *)0x0) {
      local_158.field_2._M_allocated_capacity = local_40->size * 8 + 1;
    }
    local_138 = uVar4;
    local_130 = (Alloc *)local_60._8_8_;
    local_128 = pvVar6;
    if ((local_60._8_8_ & 7) == 0 && (Alloc *)local_60._8_8_ != (Alloc *)0x0) {
      *(int *)(local_60._8_8_ + 0x30) = *(int *)(local_60._8_8_ + 0x30) + -1;
      local_130 = (Alloc *)(*(size_t *)local_60._8_8_ * 8 + 1);
    }
    local_98 = (Alloc *)0x0;
    pvStack_90 = (void *)0x0;
    entering_parallel = '\0';
    lVar10 = 0;
    do {
      *(bool *)((long)pvVar6 + lVar10) = (*(byte *)((long)pvVar3 + lVar10) & 3) == uVar4;
      lVar10 = lVar10 + 1;
    } while (iVar13 != (int)lVar10);
    local_158.field_2._8_8_ = pvVar3;
    filter_parents(Omega_h::Parents,int)::$_0::~__0((__0 *)&local_158);
  }
  ScopedTimer::~ScopedTimer(&local_159);
  pAVar15 = local_38;
  local_78._16_8_ = local_d8.shared_alloc_.alloc;
  local_60._M_allocated_capacity = (size_type)local_d8.shared_alloc_.direct_ptr;
  if ((((ulong)local_d8.shared_alloc_.alloc & 7) == 0 &&
       local_d8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_d8.shared_alloc_.alloc)->use_count = (local_d8.shared_alloc_.alloc)->use_count + -1;
    local_78._16_8_ = (local_d8.shared_alloc_.alloc)->size * 8 + 1;
  }
  local_d8.shared_alloc_.alloc = (Alloc *)0x0;
  local_d8.shared_alloc_.direct_ptr = (void *)0x0;
  Read<signed_char>::Read((Read<signed_char> *)local_38,(Write<signed_char> *)(local_78 + 0x10));
  uVar7 = local_78._16_8_;
  if ((local_78._16_8_ & 7) == 0 && (Alloc *)local_78._16_8_ != (Alloc *)0x0) {
    piVar2 = (int *)(local_78._16_8_ + 0x30);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc((Alloc *)local_78._16_8_);
      operator_delete((void *)uVar7,0x48);
    }
  }
  filter_parents(Omega_h::Parents,int)::$_0::~__0((__0 *)&local_c0);
  pAVar5 = local_d8.shared_alloc_.alloc;
  if (((ulong)local_d8.shared_alloc_.alloc & 7) == 0 && local_d8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar2 = &(local_d8.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_d8.shared_alloc_.alloc);
      operator_delete(pAVar5,0x48);
    }
  }
  ScopedTimer::~ScopedTimer(&local_15a);
  BVar18.write_.shared_alloc_.direct_ptr = extraout_RDX;
  BVar18.write_.shared_alloc_.alloc = pAVar15;
  return (Bytes)BVar18.write_.shared_alloc_;
}

Assistant:

Bytes filter_parents(Parents const c2p, Int const parent_dim) {
  OMEGA_H_TIME_FUNCTION;
  Write<Byte> filter(c2p.parent_idx.size());
  auto f = OMEGA_H_LAMBDA(LO c) {
    auto const code = c2p.codes[c];
    if (amr::code_parent_dim(code) == parent_dim)
      filter[c] = 1;
    else
      filter[c] = 0;
  };
  parallel_for(c2p.parent_idx.size(), std::move(f));
  return filter;
}